

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O2

int any2eucjp(uchar *dest,uchar *src,uint dest_max)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  uchar *from;
  int p1;
  
  sVar3 = strlen((char *)src);
  iVar2 = DetectKanjiCode_whatcode;
  if (sVar3 < 0x2000) {
    if (dest_max < 0x2001) {
      if (DetectKanjiCode_whatcode - 9U < 0xfffffffe) {
        DetectKanjiCode_whatcode = 8;
      }
      else {
        iVar2 = 8;
      }
      bVar8 = 1;
      iVar4 = 0;
      iVar9 = DetectKanjiCode_whatcode;
LAB_001205f5:
      do {
        do {
          iVar6 = iVar4;
          if ((bVar8 == 0) || (1 < iVar9 - 7U)) {
            if (iVar2 != 8 && iVar9 == 7) {
              iVar9 = iVar2;
              DetectKanjiCode_whatcode = iVar2;
            }
            iVar2 = DetectKanjiCode_whatcode;
            if (iVar9 == 7) {
              __s1 = getenv("LC_ALL");
              if (((__s1 == (char *)0x0) && (__s1 = getenv("LC_CTYPE"), __s1 == (char *)0x0)) &&
                 (__s1 = getenv("LANG"), __s1 == (char *)0x0)) {
                iVar9 = 5;
                iVar2 = iVar9;
              }
              else {
                iVar4 = strcmp(__s1,"ja_JP.SJIS");
                iVar9 = 6;
                iVar2 = iVar9;
                if ((iVar4 != 0) && (iVar4 = strcmp(__s1,"ja_JP.mscode"), iVar4 != 0)) {
                  iVar2 = strcmp(__s1,"ja_JP.PCK");
                  iVar9 = (iVar2 == 0) + 5;
                  iVar2 = iVar9;
                }
              }
            }
            DetectKanjiCode_whatcode = iVar2;
            iVar2 = (*(code *)((long)&DAT_001245c0 + (long)(int)(&DAT_001245c0)[iVar9 - 1]))();
            return iVar2;
          }
          lVar7 = (long)iVar6;
          lVar1 = lVar7 + 1;
          bVar8 = src[lVar7];
          iVar4 = (int)lVar1;
        } while (bVar8 == 0);
        if (bVar8 == 0x1b) {
          lVar7 = lVar7 + 2;
          bVar8 = src[lVar1];
          iVar4 = (int)lVar7;
          if (bVar8 != 0x4b) {
            if (bVar8 == 0x28) {
              bVar8 = src[lVar7];
              iVar4 = iVar6 + 3;
              if (bVar8 != 0x49) goto LAB_001205f5;
              DetectKanjiCode_whatcode = 3;
              iVar9 = 3;
            }
            else {
              if (bVar8 != 0x24) goto LAB_001205f5;
              bVar8 = src[lVar7];
              if (bVar8 == 0x42) {
                DetectKanjiCode_whatcode = 1;
                iVar9 = 1;
              }
              else {
                iVar4 = iVar6 + 3;
                if (bVar8 != 0x40) goto LAB_001205f5;
                DetectKanjiCode_whatcode = 2;
                iVar9 = 2;
              }
            }
            bVar8 = 1;
            iVar4 = iVar6 + 3;
            goto LAB_001205f5;
          }
          DetectKanjiCode_whatcode = 4;
          iVar9 = 4;
          bVar8 = 1;
          goto LAB_001205f5;
        }
        if (0xc < (byte)(bVar8 + 0x7f) && 0x10 < (byte)(bVar8 + 0x71)) {
          if (bVar8 != 0x8e) {
            if ((byte)(bVar8 + 0x5f) < 0x3f) {
              iVar4 = iVar6 + 2;
              bVar8 = src[lVar1];
              if (0xe < (byte)(bVar8 + 0x10)) {
                if ((byte)(bVar8 + 0x5f) < 0x3f) {
LAB_001207c9:
                  DetectKanjiCode_whatcode = 7;
                  iVar9 = 7;
                  iVar4 = iVar6 + 2;
                }
                else if ((bVar8 & 0xf0) == 0xe0) {
                  DetectKanjiCode_whatcode = 7;
                  iVar9 = 7;
                  pbVar5 = src + iVar4;
                  while ((iVar9 == 7 && (0x3f < bVar8))) {
                    iVar9 = 7;
                    if (0x80 < bVar8) {
                      iVar6 = 6;
                      if ((0x8d < bVar8) && (bVar8 == 0x8e || 0x9f < bVar8)) {
                        iVar6 = 5;
                        iVar9 = 7;
                        if (bVar8 == 0xff || bVar8 < 0xfd) goto LAB_001208bf;
                      }
                      DetectKanjiCode_whatcode = iVar6;
                      iVar9 = iVar6;
                    }
LAB_001208bf:
                    iVar4 = iVar4 + 1;
                    bVar8 = *pbVar5;
                    pbVar5 = pbVar5 + 1;
                  }
                }
                else if (bVar8 < 0xa0) {
LAB_001208d8:
                  DetectKanjiCode_whatcode = 6;
                  iVar9 = 6;
                  iVar4 = iVar6 + 2;
                }
                goto LAB_001205f5;
              }
            }
            else {
              if ((byte)(bVar8 + 0x10) < 0xf) {
                DetectKanjiCode_whatcode = 5;
                iVar9 = 5;
                goto LAB_001205f5;
              }
              if ((bVar8 & 0xf0) != 0xe0) goto LAB_001205f5;
              bVar8 = src[lVar1];
              if ((char)bVar8 < -0x5f || (byte)(bVar8 - 0x40) < 0x3f) goto LAB_001208d8;
              if (1 < (byte)(bVar8 + 3)) {
                iVar4 = iVar6 + 2;
                if ((byte)(bVar8 + 0x5f) < 0x5c) goto LAB_001207c9;
                goto LAB_001205f5;
              }
            }
            DetectKanjiCode_whatcode = 5;
            iVar9 = 5;
            iVar4 = iVar6 + 2;
            goto LAB_001205f5;
          }
          iVar4 = iVar6 + 2;
          bVar8 = src[lVar1];
          if ((((byte)(bVar8 + 0x20) < 0x1d) || ((char)bVar8 < -0x5f)) ||
             ((byte)(bVar8 - 0x40) < 0x3f)) {
            DetectKanjiCode_whatcode = 6;
            iVar9 = 6;
          }
          else if ((byte)(bVar8 + 0x5f) < 0x3f) {
            DetectKanjiCode_whatcode = 7;
            iVar9 = 7;
          }
          goto LAB_001205f5;
        }
        DetectKanjiCode_whatcode = 6;
        iVar9 = 6;
      } while( true );
    }
    gd_error("invalid maximum size of destination\nit should be less than %d.",0x2000);
  }
  else {
    gd_error("input string too large");
  }
  return -1;
}

Assistant:

int
any2eucjp (unsigned char *dest, unsigned char *src, unsigned int dest_max)
{
	static unsigned char tmp_dest[BUFSIZ];
	int ret;

	if (strlen ((const char *) src) >= BUFSIZ) {
		gd_error("input string too large");
		return -1;
	}
	if (dest_max > BUFSIZ) {
		gd_error
		("invalid maximum size of destination\nit should be less than %d.",
		 BUFSIZ);
		return -1;
	}
	ret = do_check_and_conv (tmp_dest, src);
	if (strlen ((const char *) tmp_dest) >= dest_max) {
		gd_error("output buffer overflow");
		ustrcpy (dest, src);
		return -1;
	}
	ustrcpy (dest, tmp_dest);
	return ret;
}